

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

void zisofs_detect_magic(archive_write *a,void *buff,size_t s)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long *plVar13;
  bool bVar14;
  
  pvVar5 = a->format_data;
  lVar6 = *(long *)((long)pvVar5 + 0x10);
  uVar7 = archive_entry_size(*(archive_entry **)(lVar6 + 0x20));
  uVar9 = 0x40;
  if ((long)uVar7 < 0x40) {
    uVar9 = uVar7;
  }
  lVar8 = (long)*(int *)((long)pvVar5 + 0x21c);
  iVar12 = (int)uVar9;
  if ((lVar8 != 0) || (s < (ulong)(long)iVar12)) {
    if (*(int *)((long)pvVar5 + 0x21c) < iVar12) {
      uVar9 = 0x40U - lVar8;
      if (s <= 0x40U - lVar8) {
        uVar9 = s;
      }
      memcpy((void *)((long)pvVar5 + lVar8 + 0x1d9),buff,uVar9);
      iVar10 = (int)uVar9 + *(int *)((long)pvVar5 + 0x21c);
      *(int *)((long)pvVar5 + 0x21c) = iVar10;
      if (iVar10 < iVar12) {
        return;
      }
    }
    buff = (void *)((long)pvVar5 + 0x1d9);
  }
  *(byte *)((long)pvVar5 + 0x1d8) = *(byte *)((long)pvVar5 + 0x1d8) & 0xfe;
  if (*buff == 0x7d6dbc99653e437) {
    uVar2 = *(uint *)((long)buff + 8);
    bVar1 = *(byte *)((long)buff + 0xd);
    if ((*(char *)((long)buff + 0xc) == '\x04' && 0x17 < (ulong)uVar2) &&
        0xe7 < (byte)(bVar1 - 0x1f)) {
      uVar11 = (ulong)uVar2 - 1 >> (bVar1 & 0x3f);
      uVar9 = uVar11 * 4 + 0x18;
      if ((long)uVar9 <= (long)uVar7) {
        lVar8 = uVar11 + 1;
        for (plVar13 = (long *)((long)buff + 0x18);
            (bVar14 = lVar8 != 0, lVar8 = lVar8 + -1, bVar14 &&
            (plVar13 <= (long *)((long)iVar12 + (long)buff))); plVar13 = (long *)((long)plVar13 + 4)
            ) {
          uVar3 = *(uint *)(plVar13 + -1);
          if (uVar9 != uVar3) {
            return;
          }
          uVar4 = *(uint *)((long)plVar13 + -4);
          if (uVar4 < uVar3) {
            return;
          }
          if (uVar7 < uVar4) {
            return;
          }
          uVar9 = uVar9 + (uVar4 - uVar3);
        }
        *(uint *)(lVar6 + 0xc4) = uVar2;
        *(undefined1 *)(lVar6 + 0xc0) = 4;
        *(byte *)(lVar6 + 0xc1) = bVar1;
        *(byte *)((long)pvVar5 + 0x1d8) = *(byte *)((long)pvVar5 + 0x1d8) & 0xfd;
      }
    }
  }
  return;
}

Assistant:

static void
zisofs_detect_magic(struct archive_write *a, const void *buff, size_t s)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isofile *file = iso9660->cur_file;
	const unsigned char *p, *endp;
	const unsigned char *magic_buff;
	uint32_t uncompressed_size;
	unsigned char header_size;
	unsigned char log2_bs;
	size_t _ceil, doff;
	uint32_t bst, bed;
	int magic_max;
	int64_t entry_size;

	entry_size = archive_entry_size(file->entry);
	if ((int64_t)sizeof(iso9660->zisofs.magic_buffer) > entry_size)
		magic_max = (int)entry_size;
	else
		magic_max = sizeof(iso9660->zisofs.magic_buffer);

	if (iso9660->zisofs.magic_cnt == 0 && s >= (size_t)magic_max)
		/* It's unnecessary we copy buffer. */
		magic_buff = buff;
	else {
		if (iso9660->zisofs.magic_cnt < magic_max) {
			size_t l;

			l = sizeof(iso9660->zisofs.magic_buffer)
			    - iso9660->zisofs.magic_cnt;
			if (l > s)
				l = s;
			memcpy(iso9660->zisofs.magic_buffer
			    + iso9660->zisofs.magic_cnt, buff, l);
			iso9660->zisofs.magic_cnt += (int)l;
			if (iso9660->zisofs.magic_cnt < magic_max)
				return;
		}
		magic_buff = iso9660->zisofs.magic_buffer;
	}
	iso9660->zisofs.detect_magic = 0;
	p = magic_buff;

	/* Check the magic code of zisofs. */
	if (memcmp(p, zisofs_magic, sizeof(zisofs_magic)) != 0)
		/* This is not zisofs file which made by mkzftree. */
		return;
	p += sizeof(zisofs_magic);

	/* Read a zisofs header. */
	uncompressed_size = archive_le32dec(p);
	header_size = p[4];
	log2_bs = p[5];
	if (uncompressed_size < 24 || header_size != 4 ||
	    log2_bs > 30 || log2_bs < 7)
		return;/* Invalid or not supported header. */

	/* Calculate a size of Block Pointers of zisofs. */
	_ceil = (uncompressed_size +
	        (ARCHIVE_LITERAL_LL(1) << log2_bs) -1) >> log2_bs;
	doff = (_ceil + 1) * 4 + 16;
	if (entry_size < (int64_t)doff)
		return;/* Invalid data. */

	/* Check every Block Pointer has valid value. */
	p = magic_buff + 16;
	endp = magic_buff + magic_max;
	while (_ceil && p + 8 <= endp) {
		bst = archive_le32dec(p);
		if (bst != doff)
			return;/* Invalid data. */
		p += 4;
		bed = archive_le32dec(p);
		if (bed < bst || bed > entry_size)
			return;/* Invalid data. */
		doff += bed - bst;
		_ceil--;
	}

	file->zisofs.uncompressed_size = uncompressed_size;
	file->zisofs.header_size = header_size;
	file->zisofs.log2_bs = log2_bs;

	/* Disable making a zisofs image. */
	iso9660->zisofs.making = 0;
}